

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleMenuBar::child(QAccessibleMenuBar *this,int index)

{
  int iVar1;
  QWidget *menu;
  QWidget *this_00;
  QAccessibleInterface *pQVar2;
  long in_FS_OFFSET;
  QList<QAction_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))();
  if (index < iVar1) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    menu = (QWidget *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    QWidget::actions(&local_40,this_00);
    pQVar2 = getOrCreateMenu(menu,local_40.d.ptr[index]);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  else {
    pQVar2 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenuBar::child(int index) const
{
    if (index < childCount()) {
        return getOrCreateMenu(menuBar(), menuBar()->actions().at(index));
    }
    return nullptr;
}